

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O1

QSize __thiscall QtMWidgets::TableViewCell::minimumSizeHint(TableViewCell *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int extraout_var;
  int extraout_var_00;
  int extraout_var_01;
  int extraout_var_02;
  int extraout_var_03;
  QSize QVar6;
  int extraout_EDX;
  int extraout_var_04;
  
  iVar1 = (**(code **)(*(long *)((this->d).d)->imageLabel + 0x70))();
  (**(code **)(*(long *)((this->d).d)->imageLabel + 0x70))();
  iVar2 = FingerGeometry::height();
  iVar4 = extraout_var;
  if (extraout_var < iVar2) {
    iVar4 = iVar2;
  }
  iVar3 = (**(code **)(*(long *)((this->d).d)->textLabel + 0x70))();
  iVar2 = (**(code **)(*(long *)((this->d).d)->detailedTextLabel + 0x70))();
  if (iVar2 < iVar3) {
    iVar2 = iVar3;
  }
  (**(code **)(*(long *)((this->d).d)->textLabel + 0x70))();
  (**(code **)(*(long *)((this->d).d)->detailedTextLabel + 0x70))();
  iVar3 = extraout_var_01 + extraout_var_00;
  if (extraout_var_01 + extraout_var_00 < iVar4) {
    iVar3 = iVar4;
  }
  iVar4 = (**(code **)(*(long *)((this->d).d)->accessoryWidget + 0x70))();
  (**(code **)(*(long *)((this->d).d)->accessoryWidget + 0x70))();
  if (iVar3 <= extraout_var_02) {
    iVar3 = extraout_var_02;
  }
  iVar5 = QLayout::contentsMargins();
  QLayout::contentsMargins();
  QLayout::contentsMargins();
  QLayout::contentsMargins();
  QVar6.ht = extraout_var_03 + extraout_var_04 + iVar3;
  QVar6.wd = iVar4 + iVar1 + iVar5 + extraout_EDX + iVar2;
  return QVar6;
}

Assistant:

QSize
TableViewCell::minimumSizeHint() const
{
	int width = d->imageLabel->sizeHint().width();
	int height = qMax( d->imageLabel->sizeHint().height(),
		FingerGeometry::height() );

	const int textWidth = qMax( d->textLabel->sizeHint().width(),
		d->detailedTextLabel->sizeHint().width() );
	const int textHeight = d->textLabel->sizeHint().height() +
		d->detailedTextLabel->sizeHint().height();

	width += textWidth;
	height = qMax( height, textHeight );

	const int accessoryWidth = d->accessoryWidget->sizeHint().width();
	const int accessoryHeight = d->accessoryWidget->sizeHint().height();

	width += accessoryWidth;
	height = qMax( height, accessoryHeight );

	width += d->layout->contentsMargins().left() +
		d->layout->contentsMargins().right();
	height += d->layout->contentsMargins().bottom() +
		d->layout->contentsMargins().top();

	return QSize( width, height );
}